

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator=(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *other)

{
  Rep *pRVar1;
  undefined8 *puVar2;
  long lVar3;
  void **our_elems;
  long lVar4;
  int iVar5;
  
  if (this != other) {
    lVar3 = (long)(this->super_RepeatedPtrFieldBase).current_size_;
    if (0 < lVar3) {
      pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
      lVar4 = 0;
      do {
        puVar2 = (undefined8 *)pRVar1->elements[lVar4];
        lVar4 = lVar4 + 1;
        puVar2[1] = 0;
        *(undefined1 *)*puVar2 = 0;
      } while (lVar3 != lVar4);
      (this->super_RepeatedPtrFieldBase).current_size_ = 0;
    }
    iVar5 = (other->super_RepeatedPtrFieldBase).current_size_;
    if (iVar5 != 0) {
      pRVar1 = (other->super_RepeatedPtrFieldBase).rep_;
      our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                            (&this->super_RepeatedPtrFieldBase,iVar5);
      internal::RepeatedPtrFieldBase::
      MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                (&this->super_RepeatedPtrFieldBase,our_elems,pRVar1->elements,iVar5,
                 ((this->super_RepeatedPtrFieldBase).rep_)->allocated_size -
                 (this->super_RepeatedPtrFieldBase).current_size_);
      iVar5 = iVar5 + (this->super_RepeatedPtrFieldBase).current_size_;
      (this->super_RepeatedPtrFieldBase).current_size_ = iVar5;
      pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
      if (pRVar1->allocated_size < iVar5) {
        pRVar1->allocated_size = iVar5;
      }
    }
  }
  return this;
}

Assistant:

inline RepeatedPtrField<Element>& RepeatedPtrField<Element>::operator=(
    const RepeatedPtrField& other) {
  if (this != &other) CopyFrom(other);
  return *this;
}